

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_sgemm_pack1to16.h
# Opt level: O3

void ncnn::convolution_im2col_sgemm_transform_kernel_pack1to16_avx512
               (Mat *_kernel,Mat *kernel_tm,int inch,int outch,int kernel_w,int kernel_h)

{
  void *pvVar1;
  size_t sVar2;
  size_t sVar3;
  ulong uVar4;
  int iVar5;
  long lVar6;
  uint _w;
  void *pvVar7;
  void *pvVar8;
  undefined4 *puVar9;
  undefined4 *puVar10;
  undefined4 *puVar11;
  int k;
  ulong uVar12;
  ulong uVar13;
  Mat local_78;
  
  _w = kernel_w * kernel_h;
  Mat::reshape(&local_78,_kernel,_w,inch,outch,(Allocator *)0x0);
  iVar5 = outch + 0xf;
  if (-1 < outch) {
    iVar5 = outch;
  }
  Mat::create(kernel_tm,_w * 0x10,inch,iVar5 >> 4,4,(Allocator *)0x0);
  if (0xf < outch) {
    pvVar1 = kernel_tm->data;
    sVar2 = kernel_tm->cstep;
    sVar3 = kernel_tm->elemsize;
    uVar4 = 0;
    do {
      if (0 < inch) {
        pvVar7 = (void *)((uVar4 >> 4) * sVar2 * sVar3 + (long)pvVar1);
        puVar10 = (undefined4 *)(local_78.cstep * local_78.elemsize * uVar4 + (long)local_78.data);
        uVar13 = 0;
        do {
          if (0 < (int)_w) {
            uVar12 = 0;
            puVar11 = puVar10;
            do {
              pvVar8 = pvVar7;
              lVar6 = 0;
              puVar9 = puVar11;
              do {
                *(undefined4 *)((long)pvVar8 + lVar6) = *puVar9;
                puVar9 = (undefined4 *)((long)puVar9 + local_78.cstep * local_78.elemsize);
                lVar6 = lVar6 + 4;
              } while (lVar6 != 0x40);
              uVar12 = uVar12 + 1;
              puVar11 = puVar11 + 1;
              pvVar7 = (void *)((long)pvVar8 + 0x40);
            } while (uVar12 != _w);
            pvVar7 = (void *)((long)pvVar8 + 0x40);
          }
          uVar13 = uVar13 + 1;
          puVar10 = (undefined4 *)((long)puVar10 + (long)local_78.w * local_78.elemsize);
        } while (uVar13 != (uint)inch);
      }
      uVar13 = uVar4 + 0x1f;
      uVar4 = uVar4 + 0x10;
    } while (uVar13 < (uint)outch);
  }
  if (local_78.refcount != (int *)0x0) {
    LOCK();
    *local_78.refcount = *local_78.refcount + -1;
    UNLOCK();
    if (*local_78.refcount == 0) {
      if (local_78.allocator == (Allocator *)0x0) {
        if (local_78.data != (void *)0x0) {
          free(local_78.data);
        }
      }
      else {
        (*(local_78.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return;
}

Assistant:

static void convolution_im2col_sgemm_transform_kernel_pack1to16_avx512(const Mat& _kernel, Mat& kernel_tm, int inch, int outch, int kernel_w, int kernel_h)
{
    const int maxk = kernel_w * kernel_h;

    // interleave
    // src = maxk-inch-outch
    // dst = 16b-maxk-inch-outch/16b
    Mat kernel = _kernel.reshape(maxk, inch, outch);
    kernel_tm.create(16 * maxk, inch, outch / 16);

    for (int q = 0; q + 15 < outch; q += 16)
    {
        float* g00 = kernel_tm.channel(q / 16);

        for (int p = 0; p < inch; p++)
        {
            for (int k = 0; k < maxk; k++)
            {
                for (int j = 0; j < 16; j++)
                {
                    const float* k00 = kernel.channel(q + j).row(p);
                    g00[0] = k00[k];
                    g00++;
                }
            }
        }
    }
}